

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

CharReader * __thiscall Json::CharReaderBuilder::newCharReader(CharReaderBuilder *this)

{
  bool bVar1;
  Value *pVVar2;
  OurCharReader *this_00;
  Value *this_01;
  OurFeatures OVar3;
  OurFeatures local_30;
  undefined1 local_20 [8];
  OurFeatures features;
  bool collectComments;
  CharReaderBuilder *this_local;
  
  this_01 = &this->settings_;
  unique0x100001f7 = this;
  pVVar2 = Value::operator[](this_01,"collectComments");
  features.allowSpecialFloats_ = Value::asBool(pVVar2);
  OVar3 = OurFeatures::all();
  local_30.stackLimit_ = OVar3.stackLimit_;
  features.allowComments_ = (bool)(undefined1)local_30.stackLimit_;
  features.strictRoot_ = (bool)local_30.stackLimit_._1_1_;
  features.allowDroppedNullPlaceholders_ = (bool)local_30.stackLimit_._2_1_;
  features.allowNumericKeys_ = (bool)local_30.stackLimit_._3_1_;
  local_30._0_8_ = OVar3._0_8_;
  local_20[0] = local_30.allowComments_;
  local_20[1] = local_30.strictRoot_;
  local_20[2] = local_30.allowDroppedNullPlaceholders_;
  local_20[3] = local_30.allowNumericKeys_;
  local_20[4] = local_30.allowSingleQuotes_;
  local_20[5] = local_30.failIfExtra_;
  local_20[6] = local_30.rejectDupKeys_;
  local_20[7] = local_30.allowSpecialFloats_;
  pVVar2 = Value::operator[](this_01,"allowComments");
  bVar1 = Value::asBool(pVVar2);
  local_20[0] = bVar1;
  pVVar2 = Value::operator[](this_01,"strictRoot");
  bVar1 = Value::asBool(pVVar2);
  local_20[1] = bVar1;
  pVVar2 = Value::operator[](this_01,"allowDroppedNullPlaceholders");
  bVar1 = Value::asBool(pVVar2);
  local_20[2] = bVar1;
  pVVar2 = Value::operator[](this_01,"allowNumericKeys");
  bVar1 = Value::asBool(pVVar2);
  local_20[3] = bVar1;
  pVVar2 = Value::operator[](this_01,"allowSingleQuotes");
  bVar1 = Value::asBool(pVVar2);
  local_20[4] = bVar1;
  pVVar2 = Value::operator[](this_01,"stackLimit");
  features._0_4_ = Value::asInt(pVVar2);
  pVVar2 = Value::operator[](this_01,"failIfExtra");
  bVar1 = Value::asBool(pVVar2);
  local_20[5] = bVar1;
  pVVar2 = Value::operator[](this_01,"rejectDupKeys");
  bVar1 = Value::asBool(pVVar2);
  local_20[6] = bVar1;
  pVVar2 = Value::operator[](this_01,"allowSpecialFloats");
  bVar1 = Value::asBool(pVVar2);
  local_20[7] = bVar1;
  this_00 = (OurCharReader *)operator_new(0x130);
  OurCharReader::OurCharReader
            (this_00,(bool)(features.allowSpecialFloats_ & 1),(OurFeatures *)local_20);
  return &this_00->super_CharReader;
}

Assistant:

CharReader* CharReaderBuilder::newCharReader() const
{
  bool collectComments = settings_["collectComments"].asBool();
  OurFeatures features = OurFeatures::all();
  features.allowComments_ = settings_["allowComments"].asBool();
  features.strictRoot_ = settings_["strictRoot"].asBool();
  features.allowDroppedNullPlaceholders_ = settings_["allowDroppedNullPlaceholders"].asBool();
  features.allowNumericKeys_ = settings_["allowNumericKeys"].asBool();
  features.allowSingleQuotes_ = settings_["allowSingleQuotes"].asBool();
  features.stackLimit_ = settings_["stackLimit"].asInt();
  features.failIfExtra_ = settings_["failIfExtra"].asBool();
  features.rejectDupKeys_ = settings_["rejectDupKeys"].asBool();
  features.allowSpecialFloats_ = settings_["allowSpecialFloats"].asBool();
  return new OurCharReader(collectComments, features);
}